

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O3

void __thiscall
embree::sse2::
HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>::split
          (HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>
           *this,Split *split,PrimInfoExtRange *set_i,PrimInfoExtRange *lset,PrimInfoExtRange *rset)

{
  pair<unsigned_long,_unsigned_long> pVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  unsigned_long local_48;
  unsigned_long local_40;
  unsigned_long uStack_38;
  
  local_88._0_8_ = *(undefined8 *)&(set_i->super_CentGeomBBox3fa).geomBounds.lower.field_0;
  local_88._8_8_ =
       *(undefined8 *)((long)&(set_i->super_CentGeomBBox3fa).geomBounds.lower.field_0 + 8);
  local_78 = *(undefined8 *)&(set_i->super_CentGeomBBox3fa).geomBounds.upper.field_0;
  uStack_70 = *(undefined8 *)((long)&(set_i->super_CentGeomBBox3fa).geomBounds.upper.field_0 + 8);
  local_68 = *(undefined8 *)&(set_i->super_CentGeomBBox3fa).centBounds.lower.field_0;
  uStack_60 = *(undefined8 *)((long)&(set_i->super_CentGeomBBox3fa).centBounds.lower.field_0 + 8);
  local_58 = *(undefined8 *)&(set_i->super_CentGeomBBox3fa).centBounds.upper.field_0;
  uStack_50 = *(undefined8 *)((long)&(set_i->super_CentGeomBBox3fa).centBounds.upper.field_0 + 8);
  local_48 = (set_i->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  local_40 = (set_i->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  uStack_38 = (set_i->super_extended_range<unsigned_long>)._ext_end;
  if (split->sah == INFINITY) {
    deterministic_order(this,(PrimInfoExtRange *)&local_88.field_1);
    splitFallback(this,(PrimInfoExtRange *)&local_88.field_1,lset,rset);
  }
  else {
    if (split->spatial == true) {
      create_spatial_splits
                (this,(PrimInfoExtRange *)&local_88.field_1,(SpatialSplit *)split,
                 (SpatialBinMapping<16UL> *)(split->data + 0x20));
      if (local_40 - local_48 < 0xc00) {
        pVar1 = sequential_spatial_split
                          (this,(SpatialSplit *)split,(PrimInfoExtRange *)&local_88.field_1,lset,
                           rset);
      }
      else {
        pVar1 = parallel_spatial_split
                          (this,(SpatialSplit *)split,(PrimInfoExtRange *)&local_88.field_1,lset,
                           rset);
      }
    }
    else if (local_40 - local_48 < 0xc00) {
      pVar1 = sequential_object_split
                        (this,(ObjectSplit *)split,(PrimInfoExtRange *)&local_88.field_1,lset,rset);
    }
    else {
      pVar1 = parallel_object_split
                        (this,(ObjectSplit *)split,(PrimInfoExtRange *)&local_88.field_1,lset,rset);
    }
    if (uStack_38 != local_40) {
      setExtentedRanges(this,(PrimInfoExtRange *)&local_88.field_1,lset,rset,pVar1.first,
                        pVar1.second);
      moveExtentedRange(this,(PrimInfoExtRange *)&local_88.field_1,lset,rset);
    }
  }
  return;
}

Assistant:

void split(const Split& split, const PrimInfoExtRange& set_i, PrimInfoExtRange& lset, PrimInfoExtRange& rset) 
        {
          PrimInfoExtRange set = set_i;
          
          /* valid split */
          if (unlikely(!split.valid())) {
            deterministic_order(set);
            return splitFallback(set,lset,rset);
          }

          std::pair<size_t,size_t> ext_weights(0,0);

          if (unlikely(split.spatial))
          {
            create_spatial_splits(set,split.spatialSplit(), split.spatialSplit().mapping); 

            /* spatial split */
            if (likely(set.size() < PARALLEL_THRESHOLD)) 
              ext_weights = sequential_spatial_split(split.spatialSplit(),set,lset,rset);
            else
              ext_weights = parallel_spatial_split(split.spatialSplit(),set,lset,rset);
          }
          else
          {
            /* object split */
            if (likely(set.size() < PARALLEL_THRESHOLD)) 
              ext_weights = sequential_object_split(split.objectSplit(),set,lset,rset);
            else
              ext_weights = parallel_object_split(split.objectSplit(),set,lset,rset);
          }

          /* if we have an extended range, set extended child ranges and move right split range */
          if (unlikely(set.has_ext_range())) 
          {
            setExtentedRanges(set,lset,rset,ext_weights.first,ext_weights.second);
            moveExtentedRange(set,lset,rset);
          }
        }